

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::emit_for_loop_initializers_abi_cxx11_
          (CompilerGLSL *this,SPIRBlock *block)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  Types TVar4;
  SPIRVariable *pSVar5;
  Variant *pVVar6;
  size_t sVar7;
  TypedID *this_00;
  ulong uVar8;
  SPIRBlock *in_RDX;
  undefined1 local_1c8 [64];
  spirv_cross local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [32];
  spirv_cross local_128 [32];
  SPIRType *local_108;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t local_d4;
  TypedID *pTStack_d0;
  uint32_t static_expr;
  TypedID<(spirv_cross::Types)2> *loop_var_1;
  TypedID<(spirv_cross::Types)2> *__end3_1;
  TypedID<(spirv_cross::Types)2> *__begin3_1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *__range3_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  TypedID<(spirv_cross::Types)2> *local_88;
  TypedID<(spirv_cross::Types)2> *loop_var;
  TypedID<(spirv_cross::Types)2> *__end3;
  TypedID<(spirv_cross::Types)2> *__begin3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *__range3;
  TypedID<(spirv_cross::Types)2> *pTStack_60;
  uint32_t expr;
  TypedID<(spirv_cross::Types)2> *variable;
  TypedID<(spirv_cross::Types)2> *__end1;
  TypedID<(spirv_cross::Types)2> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *__range1;
  byte local_35;
  uint32_t missing_initializers;
  bool same_types;
  allocator local_21;
  SPIRBlock *local_20;
  SPIRBlock *block_local;
  CompilerGLSL *this_local;
  string *expr_1;
  
  local_20 = in_RDX;
  block_local = block;
  this_local = this;
  bVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::empty
                    (&(in_RDX->loop_variables).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>);
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    local_35 = for_loop_initializers_are_same_type((CompilerGLSL *)block,local_20);
    __range1._4_4_ = 0;
    __begin1 = (TypedID<(spirv_cross::Types)2> *)&local_20->loop_variables;
    __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::begin
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_> *)__begin1);
    variable = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::end
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_> *)__begin1);
    for (; __end1 != variable; __end1 = __end1 + 1) {
      pTStack_60 = __end1;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      pSVar5 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)block,uVar3);
      __range3._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar5->static_expression)
      ;
      if (__range3._4_4_ == 0) {
LAB_0039a8b5:
        __range1._4_4_ = __range1._4_4_ + 1;
      }
      else {
        pVVar6 = VectorView<spirv_cross::Variant>::operator[]
                           ((VectorView<spirv_cross::Variant> *)&block->condition,
                            (ulong)__range3._4_4_);
        TVar4 = Variant::get_type(pVVar6);
        if (TVar4 == TypeUndef) goto LAB_0039a8b5;
      }
    }
    sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::size
                      (&(local_20->loop_variables).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>);
    iVar1 = __range1._4_4_;
    if ((sVar7 == 1) && (__range1._4_4_ == 0)) {
      this_00 = (TypedID *)
                VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::front
                          (&(local_20->loop_variables).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>);
      uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
      pSVar5 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)block,uVar3);
      (*(block->super_IVariant)._vptr_IVariant[0x26])(this,block,pSVar5);
    }
    else if (((local_35 & 1) == 0) ||
            (sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::size
                               (&(local_20->loop_variables).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>),
            iVar1 == (int)sVar7)) {
      __begin3 = (TypedID<(spirv_cross::Types)2> *)&local_20->loop_variables;
      __end3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::begin
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_> *)__begin3);
      loop_var = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::end
                           ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_> *)__begin3);
      for (; __end3 != loop_var; __end3 = __end3 + 1) {
        local_88 = __end3;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end3);
        pSVar5 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)block,uVar3);
        (*(block->super_IVariant)._vptr_IVariant[0x26])(local_a8,block,pSVar5);
        statement<std::__cxx11::string,char_const(&)[2]>
                  ((CompilerGLSL *)block,local_a8,(char (*) [2])0x5b3b6f);
        ::std::__cxx11::string::~string((string *)local_a8);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",(allocator *)((long)&__range3_1 + 7));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
    }
    else {
      __range3_1._6_1_ = 0;
      ::std::__cxx11::string::string((string *)this);
      __begin3_1 = (TypedID<(spirv_cross::Types)2> *)&local_20->loop_variables;
      __end3_1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::begin
                           ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_> *)__begin3_1);
      loop_var_1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::end
                             ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_> *)__begin3_1
                             );
      for (; __end3_1 != loop_var_1; __end3_1 = __end3_1 + 1) {
        pTStack_d0 = (TypedID *)__end3_1;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end3_1);
        pSVar5 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)block,uVar3);
        local_d4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar5->static_expression);
        if (local_d4 == 0) {
LAB_0039ab8a:
          uVar3 = TypedID::operator_cast_to_unsigned_int(pTStack_d0);
          pSVar5 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)block,uVar3);
          (*(block->super_IVariant)._vptr_IVariant[0x26])(&var,block,pSVar5);
          statement<std::__cxx11::string,char_const(&)[2]>
                    ((CompilerGLSL *)block,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var,
                     (char (*) [2])0x5b3b6f);
          ::std::__cxx11::string::~string((string *)&var);
        }
        else {
          pVVar6 = VectorView<spirv_cross::Variant>::operator[]
                             ((VectorView<spirv_cross::Variant> *)&block->condition,(ulong)local_d4)
          ;
          TVar4 = Variant::get_type(pVVar6);
          if (TVar4 == TypeUndef) goto LAB_0039ab8a;
          uVar3 = TypedID::operator_cast_to_unsigned_int(pTStack_d0);
          type = (SPIRType *)Compiler::get<spirv_cross::SPIRVariable>((Compiler *)block,uVar3);
          local_108 = Compiler::get_variable_data_type((Compiler *)block,(SPIRVariable *)type);
          uVar8 = ::std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            ::std::__cxx11::string::operator+=((string *)this,", ");
            if ((local_108->pointer & 1U) != 0) {
              ::std::__cxx11::string::operator+=((string *)this,"* ");
            }
          }
          else {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
            (*(block->super_IVariant)._vptr_IVariant[0x2f])(local_148,block,(ulong)uVar3);
            (*(block->super_IVariant)._vptr_IVariant[0x13])(local_168,block,local_108,0);
            join<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                      (local_128,local_148,local_168,(char (*) [2])0x5b521c);
            ::std::__cxx11::string::operator=((string *)this,(string *)local_128);
            ::std::__cxx11::string::~string((string *)local_128);
            ::std::__cxx11::string::~string((string *)local_168);
            ::std::__cxx11::string::~string((string *)local_148);
          }
          uVar3 = TypedID::operator_cast_to_unsigned_int(pTStack_d0);
          (*(block->super_IVariant)._vptr_IVariant[6])(local_1c8 + 0x20,block,(ulong)uVar3,1);
          uVar3 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)
                             ((long)&(type->array_size_literal).super_VectorView<bool>.ptr + 4));
          to_pointer_expression_abi_cxx11_((CompilerGLSL *)local_1c8,(uint32_t)block,SUB41(uVar3,0))
          ;
          join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
                    (local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1c8 + 0x20),(char (*) [4])0x5cb349,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8)
          ;
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_188);
          ::std::__cxx11::string::~string((string *)local_188);
          ::std::__cxx11::string::~string((string *)local_1c8);
          ::std::__cxx11::string::~string((string *)(local_1c8 + 0x20));
        }
      }
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::emit_for_loop_initializers(const SPIRBlock &block)
{
	if (block.loop_variables.empty())
		return "";

	bool same_types = for_loop_initializers_are_same_type(block);
	// We can only declare for loop initializers if all variables are of same type.
	// If we cannot do this, declare individual variables before the loop header.

	// We might have a loop variable candidate which was not assigned to for some reason.
	uint32_t missing_initializers = 0;
	for (auto &variable : block.loop_variables)
	{
		uint32_t expr = get<SPIRVariable>(variable).static_expression;

		// Sometimes loop variables are initialized with OpUndef, but we can just declare
		// a plain variable without initializer in this case.
		if (expr == 0 || ir.ids[expr].get_type() == TypeUndef)
			missing_initializers++;
	}

	if (block.loop_variables.size() == 1 && missing_initializers == 0)
	{
		return variable_decl(get<SPIRVariable>(block.loop_variables.front()));
	}
	else if (!same_types || missing_initializers == uint32_t(block.loop_variables.size()))
	{
		for (auto &loop_var : block.loop_variables)
			statement(variable_decl(get<SPIRVariable>(loop_var)), ";");
		return "";
	}
	else
	{
		// We have a mix of loop variables, either ones with a clear initializer, or ones without.
		// Separate the two streams.
		string expr;

		for (auto &loop_var : block.loop_variables)
		{
			uint32_t static_expr = get<SPIRVariable>(loop_var).static_expression;
			if (static_expr == 0 || ir.ids[static_expr].get_type() == TypeUndef)
			{
				statement(variable_decl(get<SPIRVariable>(loop_var)), ";");
			}
			else
			{
				auto &var = get<SPIRVariable>(loop_var);
				auto &type = get_variable_data_type(var);
				if (expr.empty())
				{
					// For loop initializers are of the form <type id = value, id = value, id = value, etc ...
					expr = join(to_qualifiers_glsl(var.self), type_to_glsl(type), " ");
				}
				else
				{
					expr += ", ";
					// In MSL, being based on C++, the asterisk marking a pointer
					// binds to the identifier, not the type.
					if (type.pointer)
						expr += "* ";
				}

				expr += join(to_name(loop_var), " = ", to_pointer_expression(var.static_expression));
			}
		}
		return expr;
	}
}